

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSThread.h
# Opt level: O2

int DetachThread(THREAD_IDENTIFIER ThreadId)

{
  int iVar1;
  
  iVar1 = pthread_detach(ThreadId);
  return (int)(iVar1 != 0);
}

Assistant:

inline int DetachThread(THREAD_IDENTIFIER ThreadId)
{
#ifdef _WIN32
	// For Windows, there is no problem of detached or joinable state.
	// Anyway, all the resources used by the thread are released when
	// it is terminated and all the handles to it are closed. 
	// All attempts to open a handle to it after it is terminated will fail.
	// And while it is not terminated, we can wait for it with WaitForSingleObject(). 
	UNREFERENCED_PARAMETER(ThreadId);
#else 
	// Indicate that storage for the thread can be reclaimed when it terminates.
	// Note : pthread_detach() may fail if the thread identifier is bad. This can be because 
	// it was an invalid thread identifier or the thread has already terminated but this would mean that 
	// pthread_detach() or pthread_join() have already been called successfully...
	if (pthread_detach(ThreadId) != EXIT_SUCCESS)
	{
		PRINT_DEBUG_ERROR_OSTHREAD(("DetachThread error (%s) : %s"
			"(ThreadId=%#x)\n", 
			strtime_m(), 
			"pthread_detach failed. ", 
			ThreadId));
		return EXIT_FAILURE;
	}
#endif // _WIN32

	return EXIT_SUCCESS;
}